

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

buffer_appender<char>
fmt::v7::detail::write_exponent<char,fmt::v7::detail::buffer_appender<char>>
          (int exp,buffer_appender<char> it)

{
  back_insert_iterator<fmt::v7::detail::buffer<char>_> *pbVar1;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> local_88;
  value_type local_79;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> local_78;
  value_type local_69;
  value_type *local_68;
  char *d;
  value_type local_51;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> local_50;
  value_type local_41;
  value_type *local_40;
  char *top;
  value_type local_29;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> local_28;
  value_type local_1d;
  int local_1c;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> bStack_18;
  int exp_local;
  buffer_appender<char> it_local;
  
  local_1c = exp;
  bStack_18 = it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container;
  if ((-10000 < exp) && (exp < 10000)) {
    if (exp < 0) {
      local_1d = '-';
      local_28 = std::back_insert_iterator<fmt::v7::detail::buffer<char>_>::operator++
                           (&stack0xffffffffffffffe8,0);
      pbVar1 = std::back_insert_iterator<fmt::v7::detail::buffer<char>_>::operator*(&local_28);
      std::back_insert_iterator<fmt::v7::detail::buffer<char>_>::operator=(pbVar1,&local_1d);
      local_1c = -local_1c;
    }
    else {
      local_29 = '+';
      top = (char *)std::back_insert_iterator<fmt::v7::detail::buffer<char>_>::operator++
                              (&stack0xffffffffffffffe8,0);
      pbVar1 = std::back_insert_iterator<fmt::v7::detail::buffer<char>_>::operator*
                         ((back_insert_iterator<fmt::v7::detail::buffer<char>_> *)&top);
      std::back_insert_iterator<fmt::v7::detail::buffer<char>_>::operator=(pbVar1,&local_29);
    }
    if (99 < local_1c) {
      local_40 = basic_data<void>::digits + (long)(local_1c / 100) * 2;
      if (999 < local_1c) {
        local_41 = *local_40;
        local_50 = std::back_insert_iterator<fmt::v7::detail::buffer<char>_>::operator++
                             (&stack0xffffffffffffffe8,0);
        pbVar1 = std::back_insert_iterator<fmt::v7::detail::buffer<char>_>::operator*(&local_50);
        std::back_insert_iterator<fmt::v7::detail::buffer<char>_>::operator=(pbVar1,&local_41);
      }
      local_51 = local_40[1];
      d = (char *)std::back_insert_iterator<fmt::v7::detail::buffer<char>_>::operator++
                            (&stack0xffffffffffffffe8,0);
      pbVar1 = std::back_insert_iterator<fmt::v7::detail::buffer<char>_>::operator*
                         ((back_insert_iterator<fmt::v7::detail::buffer<char>_> *)&d);
      std::back_insert_iterator<fmt::v7::detail::buffer<char>_>::operator=(pbVar1,&local_51);
      local_1c = local_1c % 100;
    }
    local_68 = basic_data<void>::digits + (long)local_1c * 2;
    local_69 = *local_68;
    local_78 = std::back_insert_iterator<fmt::v7::detail::buffer<char>_>::operator++
                         (&stack0xffffffffffffffe8,0);
    pbVar1 = std::back_insert_iterator<fmt::v7::detail::buffer<char>_>::operator*(&local_78);
    std::back_insert_iterator<fmt::v7::detail::buffer<char>_>::operator=(pbVar1,&local_69);
    local_79 = local_68[1];
    local_88 = std::back_insert_iterator<fmt::v7::detail::buffer<char>_>::operator++
                         (&stack0xffffffffffffffe8,0);
    pbVar1 = std::back_insert_iterator<fmt::v7::detail::buffer<char>_>::operator*(&local_88);
    std::back_insert_iterator<fmt::v7::detail::buffer<char>_>::operator=(pbVar1,&local_79);
    return (buffer_appender<char>)
           (back_insert_iterator<fmt::v7::detail::buffer<char>_>)bStack_18.container;
  }
  assert_fail("/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/src/../extern/fmt/include/fmt/format.h"
              ,0x452,"exponent out of range");
}

Assistant:

It write_exponent(int exp, It it) {
  FMT_ASSERT(-10000 < exp && exp < 10000, "exponent out of range");
  if (exp < 0) {
    *it++ = static_cast<Char>('-');
    exp = -exp;
  } else {
    *it++ = static_cast<Char>('+');
  }
  if (exp >= 100) {
    const char* top = data::digits[exp / 100];
    if (exp >= 1000) *it++ = static_cast<Char>(top[0]);
    *it++ = static_cast<Char>(top[1]);
    exp %= 100;
  }
  const char* d = data::digits[exp];
  *it++ = static_cast<Char>(d[0]);
  *it++ = static_cast<Char>(d[1]);
  return it;
}